

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

void fs_event_cb_dir_multi_file(uv_fs_event_t *handle,char *filename,int events,int status)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  char *pcVar4;
  
  iVar3 = fs_event_cb_called + 1;
  fs_event_cb_called = iVar3;
  if (handle == &fs_event) {
    if (status == 0) {
      if (events - 1U < 2) {
        iVar1 = strncmp(filename,"fsevent-",8);
        if (iVar1 == 0) {
          if (fs_event_removed + fs_event_created == 0x10) {
            iVar3 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
            if (iVar3 != 0) {
              pcVar4 = "0 == uv_timer_start(&timer, fs_event_unlink_files, 1, 0)";
              uVar2 = 0xd9;
              goto LAB_0011a840;
            }
          }
          else if (iVar3 == 0x20) {
            uv_close(&timer,close_cb);
            uv_close(&fs_event,close_cb);
            return;
          }
          return;
        }
        pcVar4 = "strncmp(filename, file_prefix, sizeof(file_prefix) - 1) == 0";
        uVar2 = 0xd1;
      }
      else {
        pcVar4 = "events == UV_CHANGE || events == UV_RENAME";
        uVar2 = 0xcf;
      }
    }
    else {
      pcVar4 = "status == 0";
      uVar2 = 0xce;
    }
  }
  else {
    pcVar4 = "handle == &fs_event";
    uVar2 = 0xcd;
  }
LAB_0011a840:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
          ,uVar2,pcVar4);
  abort();
}

Assistant:

static void fs_event_cb_dir_multi_file(uv_fs_event_t* handle,
                                       const char* filename,
                                       int events,
                                       int status) {
  fs_event_cb_called++;
  ASSERT(handle == &fs_event);
  ASSERT(status == 0);
  ASSERT(events == UV_CHANGE || events == UV_RENAME);
  #if defined(__APPLE__) || defined(_WIN32) || defined(__linux__)
  ASSERT(strncmp(filename, file_prefix, sizeof(file_prefix) - 1) == 0);
  #else
  ASSERT(filename == NULL ||
         strncmp(filename, file_prefix, sizeof(file_prefix) - 1) == 0);
  #endif

  if (fs_event_created + fs_event_removed == fs_event_file_count) {
    /* Once we've processed all create events, delete all files */
    ASSERT(0 == uv_timer_start(&timer, fs_event_unlink_files, 1, 0));
  } else if (fs_event_cb_called == 2 * fs_event_file_count) {
    /* Once we've processed all create and delete events, stop watching */
    uv_close((uv_handle_t*) &timer, close_cb);
    uv_close((uv_handle_t*) handle, close_cb);
  }
}